

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall
JetHead::ServerSocket::bind(ServerSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  int iVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  
  __addr_00 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  __len_00._0_2_ = __addr_00[1].sa_family;
  __len_00._2_1_ = __addr_00[1].sa_data[0];
  __len_00._3_1_ = __addr_00[1].sa_data[1];
  iVar1 = ::bind((this->super_Socket).mFd,__addr_00,__len_00);
  if (iVar1 == 0) {
    if ((this->super_Socket).mSockStream == false) {
      Socket::setConnected(&this->super_Socket,true,1);
    }
  }
  else {
    pcVar2 = inet_ntop(2,__addr_00->sa_data + 2,__addr_00[1].sa_data + 2,0x10);
    jh_log_print(3,"int JetHead::ServerSocket::bind(const Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x347,"Bind Failed on %s:%d",pcVar2,
                 (uint)(ushort)(*(ushort *)__addr_00->sa_data << 8 |
                               *(ushort *)__addr_00->sa_data >> 8));
  }
  return iVar1;
}

Assistant:

int ServerSocket::bind( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len;
	const struct sockaddr *saddr = addr.getAddr( len );
	int res = ::bind( getFd(), saddr, len );

	// for UDP sockets set connected on bind, since listen will not be called.
	if ( res == 0 )
	{
		if ( isSockStream() == false )
			setConnected( true );
	}
	else
		LOG_WARN_PERROR( "Bind Failed on %s:%d", 
						 addr.getName(), addr.getPort() );
		
	LOG_INFO( "bind to %s on port %d", addr.getName(), addr.getPort() );
	
	return res;
}